

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall
CommandLineArguments::addGroupDotNameFilter
          (CommandLineArguments *this,int ac,char **av,int *i,SimpleString *parameterName,
          bool strict,bool exclude)

{
  size_t sVar1;
  TestFilter *pTVar2;
  SimpleString *pSVar3;
  SimpleString *this_00;
  TestFilter *pTVar4;
  TestFilter *nameFilter;
  SimpleString local_b0;
  TestFilter *local_a0;
  TestFilter *groupFilter;
  SimpleString local_90 [2];
  undefined1 local_70 [8];
  SimpleStringCollection collection;
  SimpleString groupDotName;
  bool exclude_local;
  bool strict_local;
  SimpleString *parameterName_local;
  int *i_local;
  char **av_local;
  int ac_local;
  CommandLineArguments *this_local;
  
  getParameterField((CommandLineArguments *)&collection.size_,(int)this,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)i);
  SimpleStringCollection::SimpleStringCollection((SimpleStringCollection *)local_70);
  SimpleString::SimpleString(local_90,".");
  SimpleString::split((SimpleString *)&collection.size_,local_90,(SimpleStringCollection *)local_70)
  ;
  SimpleString::~SimpleString(local_90);
  sVar1 = SimpleStringCollection::size((SimpleStringCollection *)local_70);
  if (sVar1 == 2) {
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/CommandLineArguments.cpp"
                          ,0x136);
    pSVar3 = SimpleStringCollection::operator[]((SimpleStringCollection *)local_70,0);
    this_00 = SimpleStringCollection::operator[]((SimpleStringCollection *)local_70,0);
    SimpleString::size(this_00);
    SimpleString::subString(&local_b0,(size_t)pSVar3,0);
    TestFilter::TestFilter(pTVar2,&local_b0);
    SimpleString::~SimpleString(&local_b0);
    local_a0 = pTVar2;
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/CommandLineArguments.cpp"
                          ,0x137);
    pSVar3 = SimpleStringCollection::operator[]((SimpleStringCollection *)local_70,1);
    TestFilter::TestFilter(pTVar2,pSVar3);
    if (strict) {
      TestFilter::strictMatching(local_a0);
      TestFilter::strictMatching(pTVar2);
    }
    if (exclude) {
      TestFilter::invertMatching(local_a0);
      TestFilter::invertMatching(pTVar2);
    }
    pTVar4 = TestFilter::add(local_a0,this->groupFilters_);
    this->groupFilters_ = pTVar4;
    pTVar2 = TestFilter::add(pTVar2,this->nameFilters_);
    this->nameFilters_ = pTVar2;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  groupFilter._4_4_ = 1;
  SimpleStringCollection::~SimpleStringCollection((SimpleStringCollection *)local_70);
  SimpleString::~SimpleString((SimpleString *)&collection.size_);
  return this_local._7_1_;
}

Assistant:

bool CommandLineArguments::addGroupDotNameFilter(int ac, const char *const *av, int& i, const SimpleString& parameterName, 
                                                 bool strict, bool exclude)
{
    SimpleString groupDotName = getParameterField(ac, av, i, parameterName);
    SimpleStringCollection collection;
    groupDotName.split(".", collection);

    if (collection.size() != 2) return false;

    TestFilter* groupFilter = new TestFilter(collection[0].subString(0, collection[0].size()-1));
    TestFilter* nameFilter = new TestFilter(collection[1]);
    if (strict)
    {
        groupFilter->strictMatching();
        nameFilter->strictMatching();
    }
    if (exclude)
    {
        groupFilter->invertMatching();
        nameFilter->invertMatching();
    }
    groupFilters_ = groupFilter->add(groupFilters_);
    nameFilters_ = nameFilter->add(nameFilters_);
    return true;
}